

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

ParseResult *
tinyusdz::prim::anon_unknown_0::ParseExtentAttribute
          (ParseResult *__return_storage_ptr__,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *table,string *prop_name,Property *prop,string *name,
          TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *target)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  PrimVar *this;
  pointer pPVar2;
  pointer pPVar3;
  vtable_type *pvVar4;
  void *pvVar5;
  bool bVar6;
  undefined8 uVar7;
  TimeSamples *pTVar8;
  byte bVar9;
  bool bVar10;
  uint32_t uVar11;
  ParseResult *pPVar12;
  const_iterator cVar13;
  pointer pSVar14;
  ParseResult *extraout_RAX;
  ParseResult *extraout_RAX_00;
  size_type *psVar15;
  long lVar16;
  pointer pSVar17;
  string *psVar18;
  ulong uVar19;
  string attr_type_name;
  optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_> local_148
  ;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  string *local_118;
  Property *local_110;
  size_type local_108;
  undefined2 uStack_100;
  undefined6 uStack_fe;
  undefined2 local_f8;
  undefined6 uStack_f6;
  undefined2 local_f0;
  TypedTimeSamples<tinyusdz::Extent> local_e8;
  TimeSamples *local_c8;
  size_type sStack_b8;
  undefined2 uStack_b0;
  undefined6 local_ae;
  undefined2 uStack_a8;
  undefined8 uStack_a6;
  undefined1 local_98 [32];
  byte local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  undefined2 uStack_60;
  undefined8 uStack_5e;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  long local_40;
  undefined1 local_38;
  
  paVar1 = &(__return_storage_ptr__->err).field_2;
  (__return_storage_ptr__->err)._M_dataplus._M_p = (pointer)paVar1;
  (__return_storage_ptr__->err)._M_string_length = 0;
  (__return_storage_ptr__->err).field_2._M_local_buf[0] = '\0';
  pPVar12 = (ParseResult *)::std::__cxx11::string::compare((string *)prop_name);
  if ((int)pPVar12 != 0) goto LAB_001ecc30;
  cVar13 = ::std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)table,name);
  if ((_Rb_tree_header *)cVar13._M_node != &(table->_M_t)._M_impl.super__Rb_tree_header) {
    __return_storage_ptr__->code = AlreadyProcessed;
    return (ParseResult *)cVar13._M_node;
  }
  psVar18 = (string *)&__return_storage_ptr__->err;
  Attribute::type_name_abi_cxx11_((string *)local_98,&prop->_attrib);
  if (prop->_type == Attrib) {
    pPVar2 = (prop->_attrib)._paths.
             super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
             super__Vector_impl_data._M_start;
    pPVar3 = (prop->_attrib)._paths.
             super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_120 = name;
    if (pPVar3 != pPVar2) {
      std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&target->_paths,
                 &(prop->_attrib)._paths);
    }
    if ((prop->_attrib)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (prop->_attrib)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pvVar4 = (prop->_attrib)._var._value.v_.vtable;
      if (pvVar4 == (vtable_type *)0x0) {
        bVar10 = false;
      }
      else {
        uVar11 = (*pvVar4->type_id)();
        bVar10 = uVar11 == 4;
      }
      bVar9 = (prop->_attrib)._var._blocked;
      if (bVar10 || (bVar9 & 1) != 0) {
        target->_blocked = true;
      }
    }
    else {
      bVar9 = (prop->_attrib)._var._blocked;
    }
    if (((((bVar9 & 1) != 0) ||
         (pvVar4 = (prop->_attrib)._var._value.v_.vtable, pvVar4 == (vtable_type *)0x0)) ||
        ((uVar11 = (*pvVar4->type_id)(), uVar11 != 0 &&
         ((pvVar4 = (prop->_attrib)._var._value.v_.vtable, pvVar4 == (vtable_type *)0x0 ||
          (uVar11 = (*pvVar4->type_id)(), uVar11 != 1)))))) ||
       ((prop->_attrib)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (prop->_attrib)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start)) {
      this = &(prop->_attrib)._var;
      local_108 = 0x7f8000007f800000;
      uStack_100 = 0;
      uStack_fe = 0xff8000007f80;
      local_f8 = 0;
      uStack_f6 = 0xff800000ff80;
      local_f0 = 0;
      local_e8._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
      local_e8._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
      local_e8._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      local_e8._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
      local_e8._dirty = false;
      local_118 = psVar18;
      bVar10 = primvar::PrimVar::is_valid(this);
      if (bVar10) {
        local_110 = prop;
        if ((((prop->_attrib)._var._blocked == false) &&
            (pvVar4 = (prop->_attrib)._var._value.v_.vtable, pvVar4 != (vtable_type *)0x0)) &&
           ((uVar11 = (*pvVar4->type_id)(), uVar11 == 0 ||
            ((pvVar4 = (prop->_attrib)._var._value.v_.vtable, pvVar4 != (vtable_type *)0x0 &&
             (uVar11 = (*pvVar4->type_id)(), uVar11 == 1)))))) {
          pSVar17 = (prop->_attrib)._var._ts._samples.
                    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pSVar14 = (prop->_attrib)._var._ts._samples.
                    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (pSVar14 == pSVar17) goto LAB_001ed0d1;
LAB_001ece76:
          if (pSVar14 == pSVar17) goto LAB_001ecfc7;
          local_c8 = &(prop->_attrib)._var._ts;
          lVar16 = 0;
          uVar19 = 0;
          do {
            pTVar8 = local_c8;
            if ((prop->_attrib)._var._ts._dirty == true) {
              tinyusdz::value::TimeSamples::update(local_c8);
              pSVar17 = (pTVar8->_samples).
                        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            if ((&pSVar17->blocked)[lVar16] == true) {
              TypedTimeSamples<tinyusdz::Extent>::add_blocked_sample
                        (&local_e8,*(double *)((long)&pSVar17->t + lVar16));
            }
            else {
              tinyusdz::value::Value::
              get_value<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                        (&local_148,(Value *)((long)&(pSVar17->value).v_.storage + lVar16),false);
              uVar7 = local_148.contained._16_8_;
              if (local_148.has_value_ != true) goto LAB_001ed0d1;
              psVar15 = (size_type *)CONCAT44(local_148.contained._4_4_,local_148.contained._0_4_);
              if (CONCAT44(local_148.contained._12_4_,local_148.contained._8_4_) - (long)psVar15 !=
                  0x18) {
                if (psVar15 == (size_type *)0x0) goto LAB_001ed0d1;
                uVar19 = local_148.contained._16_8_ - (long)psVar15;
                goto LAB_001ed0cc;
              }
              local_148.contained._0_4_ = (undefined4)psVar15[1];
              local_148._0_8_ = *psVar15;
              local_148.contained._12_4_ = *(undefined4 *)((long)psVar15 + 0x14);
              local_148.contained._4_4_ = (undefined4)*(undefined8 *)((long)psVar15 + 0xc);
              local_148.contained._8_4_ =
                   (undefined4)((ulong)*(undefined8 *)((long)psVar15 + 0xc) >> 0x20);
              TypedTimeSamples<tinyusdz::Extent>::add_sample
                        (&local_e8,*(double *)((long)&pSVar17->t + lVar16),(Extent *)&local_148);
              operator_delete(psVar15,uVar7 - (long)psVar15);
              prop = local_110;
            }
            uVar19 = uVar19 + 1;
            pSVar17 = (prop->_attrib)._var._ts._samples.
                      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar16 = lVar16 + 0x28;
          } while (uVar19 < (ulong)(((long)(prop->_attrib)._var._ts._samples.
                                           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pSVar17 >> 3) * -0x3333333333333333));
          local_40 = CONCAT71(local_e8._samples.
                              super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                              local_e8._samples.
                              super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_);
          local_50 = local_e8._samples.
                     super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
                     ._M_impl.super__Vector_impl_data._M_start._0_4_;
          uStack_4c = local_e8._samples.
                      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
                      ._M_impl.super__Vector_impl_data._M_start._4_4_;
          uStack_48 = local_e8._samples.
                      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
                      ._M_impl.super__Vector_impl_data._M_finish._0_4_;
          uStack_44 = local_e8._samples.
                      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
                      ._M_impl.super__Vector_impl_data._M_finish._4_4_;
          local_38 = local_e8._dirty;
        }
        else {
          primvar::PrimVar::
          get_value<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                    (&local_148,this);
          if (local_148.has_value_ == true) {
            psVar15 = (size_type *)CONCAT44(local_148.contained._4_4_,local_148.contained._0_4_);
            if (CONCAT44(local_148.contained._12_4_,local_148.contained._8_4_) - (long)psVar15 !=
                0x18) {
              if (psVar15 != (size_type *)0x0) {
                uVar19 = local_148.contained._16_8_ - (long)psVar15;
LAB_001ed0cc:
                operator_delete(psVar15,uVar19);
              }
              goto LAB_001ed0d1;
            }
            local_108 = *psVar15;
            uStack_100 = (undefined2)psVar15[1];
            uStack_fe = (undefined6)(psVar15[1] >> 0x10);
            local_f8 = (undefined2)psVar15[2];
            uStack_f6 = (undefined6)(psVar15[2] >> 0x10);
            local_f0 = 1;
            operator_delete(psVar15,local_148.contained._16_8_ - (long)psVar15);
          }
          pSVar17 = (local_110->_attrib)._var._ts._samples.
                    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pSVar14 = (local_110->_attrib)._var._ts._samples.
                    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          prop = local_110;
          if (pSVar14 != pSVar17) goto LAB_001ece76;
LAB_001ecfc7:
          local_50 = 0;
          uStack_4c = 0;
          uStack_48 = 0;
          uStack_44 = 0;
          local_38 = 0;
          local_40 = 0;
        }
        uStack_a6 = CONCAT26(local_f0,uStack_f6);
        uStack_a8 = local_f8;
        sStack_b8 = local_108;
        uStack_b0 = uStack_100;
        local_ae = uStack_fe;
        local_78 = 1;
        local_70._M_allocated_capacity = local_108;
        local_70._8_2_ = uStack_100;
        local_70._10_6_ = uStack_fe;
        uStack_60 = local_f8;
        uStack_5e = uStack_a6;
        nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Extent>>::operator=
                  ((optional<tinyusdz::Animatable<tinyusdz::Extent>> *)&target->_attrib,
                   (Animatable<tinyusdz::Extent> *)&local_70);
        psVar18 = local_118;
        if (((local_78 & 1) != 0) &&
           (pvVar5 = (void *)CONCAT44(uStack_4c,local_50), pvVar5 != (void *)0x0)) {
          operator_delete(pvVar5,local_40 - (long)pvVar5);
        }
        AttrMetas::operator=(&target->_metas,&(prop->_attrib)._metas);
        name = local_120;
        goto LAB_001ed074;
      }
LAB_001ed0d1:
      if (local_e8._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e8._samples.
                        super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        CONCAT71(local_e8._samples.
                                 super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                 local_e8._samples.
                                 super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) -
                        (long)local_e8._samples.
                              super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      psVar18 = local_118;
      __return_storage_ptr__->code = InternalError;
      ::std::__cxx11::string::operator=
                (local_118,
                 "Converting Attribute data failed. Maybe TimeSamples have values with different types?"
                );
      goto LAB_001ed108;
    }
    if (pPVar3 != pPVar2) {
      AttrMetas::operator=(&target->_metas,&(prop->_attrib)._metas);
      name = local_120;
      goto LAB_001ed074;
    }
    bVar10 = true;
    bVar6 = false;
  }
  else if (prop->_type == EmptyAttrib) {
    target->_value_empty = true;
    AttrMetas::operator=(&target->_metas,&(prop->_attrib)._metas);
LAB_001ed074:
    ::std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)table,name);
    __return_storage_ptr__->code = Success;
LAB_001ed108:
    bVar6 = true;
    bVar10 = false;
  }
  else {
    bVar10 = false;
    ::std::__cxx11::string::_M_replace
              ((ulong)psVar18,0,(char *)(__return_storage_ptr__->err)._M_string_length,0x3a1d28);
    __return_storage_ptr__->code = InternalError;
    bVar6 = true;
  }
  pPVar12 = (ParseResult *)(local_98 + 0x10);
  if ((ParseResult *)local_98._0_8_ != pPVar12) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
    pPVar12 = extraout_RAX;
  }
  if (!bVar10) {
    if (bVar6) {
      return pPVar12;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined1 **)psVar18 == paVar1) {
      return pPVar12;
    }
    operator_delete(*(undefined1 **)psVar18,paVar1->_M_allocated_capacity + 1);
    return extraout_RAX_00;
  }
LAB_001ecc30:
  __return_storage_ptr__->code = Unmatched;
  return pPVar12;
}

Assistant:

static ParseResult ParseExtentAttribute(std::set<std::string> &table, /* inout */
  const std::string prop_name,
  const Property &prop,
  const std::string &name,
  TypedAttribute<Animatable<Extent>> &target) /* out */
{
  ParseResult ret;

#if 0
  if (prop_name.compare(name + ".connect") == 0) {
    std::string propname = removeSuffix(name, ".connect");
    if (table.count(propname)) {
      DCOUT("Already processed: " << prop_name);
      ret.code = ParseResult::ResultCode::AlreadyProcessed;
      return ret;
    }
    if (prop.is_connection()) {
      const Attribute &attr = prop.get_attribute();
      if (attr.is_connection()) {
        target.set_connections(attr.connections());
        //target.variability = prop.attrib.variability;
        target.metas() = prop.get_attribute().metas();
        table.insert(propname);
        ret.code = ParseResult::ResultCode::Success;
        DCOUT("Added as property with connection: " << propname);
        return ret;
      } else {
        ret.code = ParseResult::ResultCode::InvalidConnection;
        ret.err = "Connection target not found.";
        return ret;
      }
    } else {
      ret.code = ParseResult::ResultCode::InternalError;
      ret.err = "Internal error. Unsupported/Unimplemented property type.";
      return ret;
    }
#endif
  if (prop_name.compare(name) == 0) {
    if (table.count(name)) {
      ret.code = ParseResult::ResultCode::AlreadyProcessed;
      return ret;
    }

    const Attribute &attr = prop.get_attribute();

    std::string attr_type_name = attr.type_name();
    if (prop.get_property_type() == Property::Type::EmptyAttrib) {
      DCOUT("Added prop with empty value: " << name);
      target.set_value_empty();
      target.metas() = attr.metas();
      table.insert(name);
      ret.code = ParseResult::ResultCode::Success;
      return ret;
    } else if (prop.get_property_type() == Property::Type::Attrib) {

      //bool has_default{false};
      bool has_connections{false};

      if (attr.has_connections()) {
        target.set_connections(attr.connections());
        //target.variability = prop.attrib.variability;
        //target.metas() = prop.get_attribute().metas();
        //table.insert(prop_name);
        //ret.code = ParseResult::ResultCode::Success;
        //return ret;
        has_connections = true;
      }

      DCOUT("Adding typed extent attribute: " << name);

      if (attr.is_blocked()) {
        // e.g. "float3[] extent = None"
        target.set_blocked(true);
      }

#if 0
      } else {
        
        //
        // No variability check. allow `uniform extent`(promote to varying)
        //
        if (auto pv = attr.get_value<std::vector<value::float3>>()) {
          if (pv.value().size() != 2) {
            ret.code = ParseResult::ResultCode::TypeMismatch;
            ret.err = fmt::format("`extent` must be `float3[2]`, but got array size {}", pv.value().size());
            return ret;
          }

          Extent ext;
          ext.lower = pv.value()[0];
          ext.upper = pv.value()[1];

          //target.set_value(ext);
          animatable_value.set(ext);
        } else {
          ret.code = ParseResult::ResultCode::TypeMismatch;
          ret.err = fmt::format("`extent` must be `float3[]` type, but got `{}`", attr.type_name());
          return ret;
        }
      }

      if (attr.get_var().has_timesamples()) {
        // e.g. "float3[] extent.timeSamples = ..."

        if (auto av = ConvertToAnimatable<Extent>(attr.get_var())) {
          animatable_value.set(av.value().get_timesamples());
          //target.set_value(anim);
          
          has_timesamples = true;
        } else {
          // Conversion failed.
          DCOUT("ConvertToAnimatable failed.");
          ret.code = ParseResult::ResultCode::InternalError;
          ret.err = "Converting Attribute data failed. Maybe TimeSamples have values with different types or invalid array size?";
          return ret;
        }
      }

      if (has_default || has_timesamples) {
        DCOUT("Added Extent attribute: " << name);
        target.metas() = attr.metas();
        table.insert(name);
        ret.code = ParseResult::ResultCode::Success;
        return ret;
      } else {
        DCOUT("Internal error.");
        ret.code = ParseResult::ResultCode::InternalError;
        ret.err = "Internal error. Invalid Attribute data";
        return ret;
      }
#else
      
      const auto &var = attr.get_var();

      if (var.has_default() || var.has_timesamples()) {
        if (auto av = ConvertToAnimatable<Extent>(var)) {
          target.set_value(av.value());
        } else {
          DCOUT("ConvertToAnimatable failed.");
          ret.code = ParseResult::ResultCode::InternalError;
          ret.err = "Converting Attribute data failed. Maybe TimeSamples have values with different types?";
          return ret;
        }

        DCOUT("Added typed extent attribute: " << name);

        target.metas() = attr.metas();
        table.insert(name);
        ret.code = ParseResult::ResultCode::Success;
        return ret;
      }

      if (has_connections) {
        DCOUT("Added Extent connection attribute: " << name);
        target.metas() = attr.metas();
        table.insert(name);
        ret.code = ParseResult::ResultCode::Success;
        return ret;
      }

#endif

    } else {
      DCOUT("Invalid Property.type");
      ret.err = "Invalid Property type(internal error)";
      ret.code = ParseResult::ResultCode::InternalError;
      return ret;
    }

  }

  ret.code = ParseResult::ResultCode::Unmatched;
  return ret;
}